

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_evfsctuf(CPUPPCState_conflict *env,uint64_t val)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t val_local;
  CPUPPCState_conflict *env_local;
  
  uVar1 = efsctuf(env,(uint32_t)(val >> 0x20));
  uVar2 = efsctuf(env,(uint32_t)val);
  return CONCAT44(uVar1,uVar2);
}

Assistant:

static inline uint32_t efsadd(CPUPPCState *env, uint32_t op1, uint32_t op2)
{
    CPU_FloatU u1, u2;

    u1.l = op1;
    u2.l = op2;
    u1.f = float32_add(u1.f, u2.f, &env->vec_status);
    return u1.l;
}